

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessVertexShaderArguments
          (ConversionStream *this,
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          *Params,String *GlobalVariables,stringstream *ReturnHandlerSS,String *Prologue)

{
  String *Args_3;
  StorageQualifier SVar1;
  ShaderParameterInfo *pSVar2;
  ShaderParameterInfo *Args_1;
  HLSL2GLSLConverterImpl *pHVar3;
  mapped_type pcVar4;
  pointer pSVar5;
  int location;
  bool bVar6;
  ostream *poVar7;
  ShaderParameterInfo *pSVar8;
  const_iterator cVar9;
  long lVar10;
  iterator iVar11;
  mapped_type *ppcVar12;
  pointer pSVar13;
  char *pcVar14;
  pointer pSVar15;
  int iVar16;
  ShaderParameterInfo *NextMember;
  ConversionStream *pCVar17;
  int InputLocation;
  int local_5dc;
  vector<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
  MemberItStack;
  string msg;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  MemberStack;
  String GLSLVariable;
  const_iterator SemanticEndPos;
  char *EndPtr;
  String *local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  LocationToSemantic;
  stringstream PrologueSS;
  ostream local_4b8 [376];
  stringstream GlobalVarsSS;
  ostream local_330 [376];
  stringstream InterfaceVarsSS;
  
  local_518 = Prologue;
  local_510._M_allocated_capacity = (size_type)GlobalVariables;
  std::__cxx11::stringstream::stringstream((stringstream *)&GlobalVarsSS);
  std::__cxx11::stringstream::stringstream((stringstream *)&PrologueSS);
  std::__cxx11::stringstream::stringstream((stringstream *)&InterfaceVarsSS);
  LocationToSemantic._M_h._M_buckets = &LocationToSemantic._M_h._M_single_bucket;
  LocationToSemantic._M_h._M_bucket_count = 1;
  LocationToSemantic._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  LocationToSemantic._M_h._M_element_count = 0;
  LocationToSemantic._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  LocationToSemantic._M_h._M_rehash_policy._M_next_resize = 0;
  LocationToSemantic._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pSVar15 = (Params->
            super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_510._8_8_ =
       (Params->
       super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  iVar16 = 0;
  local_5dc = 0;
  do {
    if (pSVar15 == (pointer)local_510._8_8_) {
      std::__cxx11::stringbuf::str();
      std::operator<<(local_330,(string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)local_510._M_allocated_capacity,(string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)local_518,(string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
      std::
      _Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&LocationToSemantic._M_h);
      std::__cxx11::stringstream::~stringstream((stringstream *)&InterfaceVarsSS);
      std::__cxx11::stringstream::~stringstream((stringstream *)&PrologueSS);
      std::__cxx11::stringstream::~stringstream((stringstream *)&GlobalVarsSS);
      return;
    }
    SVar1 = pSVar15->storageQualifier;
    if ((SVar1 == Ret) || (SVar1 == Out)) {
      MemberStack.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      MemberStack.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MemberStack.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      msg._M_dataplus._M_p = (pointer)pSVar15;
      std::
      vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
      ::emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                  *)&MemberStack,(ShaderParameterInfo **)&msg);
      msg._M_dataplus._M_p =
           (pointer)(pSVar15->members).
                    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
      ::
      emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                  *)&MemberItStack,
                 (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                  *)&msg);
      if ((pSVar15->storageQualifier != Ret) &&
         (((pSVar15->GSAttribs).PrimType == Undefined &&
          ((pSVar15->HSAttribs).PatchType == Undefined)))) {
        poVar7 = std::operator<<(local_4b8,"    ");
        poVar7 = std::operator<<(poVar7,(pSVar15->Type)._M_dataplus._M_p);
        poVar7 = std::operator<<(poVar7,' ');
        std::operator<<(poVar7,(pSVar15->Name)._M_dataplus._M_p);
        if ((pSVar15->ArraySize)._M_string_length != 0) {
          poVar7 = std::operator<<(local_4b8,'[');
          poVar7 = std::operator<<(poVar7,(string *)&pSVar15->ArraySize);
          std::operator<<(poVar7,']');
        }
        std::operator<<(local_4b8,";\n");
      }
      while (MemberStack.
             super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             MemberStack.
             super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        pSVar2 = MemberStack.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1];
        pSVar5 = (pSVar2->members).
                 super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar13 = (pSVar2->members).
                  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pSVar5 == pSVar13) {
          if (MemberItStack.
              super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current != pSVar5) {
            FormatString<char[26],char[49]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                       (char (*) [49])pSVar5);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb19);
            std::__cxx11::string::~string((string *)&msg);
          }
          if ((pSVar2->Semantic)._M_string_length == 0) {
            LogError<true,char[36],std::__cxx11::string,char[2]>
                      (false,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar2->Name,
                       (char (*) [2])0x2dfbac);
          }
          GLSLVariable._M_dataplus._M_p = (pointer)&GLSLVariable.field_2;
          GLSLVariable._M_string_length = 0;
          GLSLVariable.field_2._M_local_buf[0] = '\0';
          pHVar3 = this->m_Converter;
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)&msg,(pSVar2->Semantic)._M_dataplus._M_p,false);
          pCVar17 = (ConversionStream *)&msg;
          cVar9 = std::
                  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(pHVar3->m_HLSLSemanticToGLSLVar)._M_elems[0]._M_elems[1]._M_h,
                         (key_type *)&msg);
          HashMapStringKey::Clear((HashMapStringKey *)&msg);
          if (cVar9.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            pCVar17 = (ConversionStream *)
                      ((long)cVar9.
                             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                             ._M_cur + 0x18);
            std::__cxx11::string::_M_assign((string *)&GLSLVariable);
          }
          pcVar14 = "";
          if (pSVar2->storageQualifier == Ret) {
            pcVar14 = "_RET_VAL_";
          }
          BuildParameterName_abi_cxx11_((String *)&msg,pCVar17,&MemberStack,'.',"",pcVar14,"");
          if (GLSLVariable._M_string_length == 0) {
            pcVar14 = "_";
            if (this->m_bUseInOutLocationQualifiers != false) {
              pcVar14 = "_vsout_";
            }
            BuildParameterName_abi_cxx11_((String *)&EndPtr,pCVar17,&MemberStack,'_',pcVar14,"","");
            bVar6 = this->m_bUseInOutLocationQualifiers;
            pcVar14 = GetInterpolationQualifier(this,pSVar2);
            location = -1;
            if (bVar6 != false) {
              location = iVar16;
            }
            DefineInterfaceVar(location,pcVar14,"out",&pSVar2->Type,(String *)&EndPtr,
                               &InterfaceVarsSS);
            poVar7 = std::operator<<((ostream *)(ReturnHandlerSS + 0x10),(string *)&EndPtr);
            poVar7 = std::operator<<(poVar7," = ");
            poVar7 = std::operator<<(poVar7,(string *)&msg);
            std::operator<<(poVar7,";\\\n");
            iVar16 = iVar16 + (uint)bVar6;
            std::__cxx11::string::~string((string *)&EndPtr);
          }
          else {
            poVar7 = std::operator<<((ostream *)(ReturnHandlerSS + 0x10),(string *)&GLSLVariable);
            poVar7 = std::operator<<(poVar7,'(');
            poVar7 = std::operator<<(poVar7,(string *)&msg);
            std::operator<<(poVar7,");\\\n");
          }
          std::__cxx11::string::~string((string *)&msg);
          MemberStack.
          super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               MemberStack.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          MemberItStack.
          super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               MemberItStack.
               super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          std::__cxx11::string::~string((string *)&GLSLVariable);
        }
        else {
          if ((pSVar2->Semantic)._M_string_length != 0) {
            LogError<true,char[35],std::__cxx11::string,char[2]>
                      (false,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar2->Name,
                       (char (*) [2])0x2dfbac);
            pSVar13 = (pSVar2->members).
                      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          pSVar5 = MemberItStack.
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current;
          if (pSVar5 == pSVar13) {
            MemberStack.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 MemberStack.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            MemberItStack.
            super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 MemberItStack.
                 super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
          }
          else {
            MemberItStack.
            super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current = pSVar5 + 1;
            msg._M_dataplus._M_p = (pointer)pSVar5;
            std::
            vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
            ::
            emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                      ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                        *)&MemberStack,(ShaderParameterInfo **)&msg);
            msg._M_dataplus._M_p =
                 (pointer)(pSVar5->members).
                          super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            std::
            vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
            ::
            emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                      ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                        *)&MemberItStack,
                       (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                        *)&msg);
          }
        }
      }
LAB_001c8d9c:
      std::
      _Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ::~_Vector_base(&MemberItStack.
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                     );
      std::
      _Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ::~_Vector_base((_Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                       *)&MemberStack);
    }
    else if (SVar1 == In) {
      MemberStack.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      MemberStack.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MemberStack.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      msg._M_dataplus._M_p = (pointer)pSVar15;
      std::
      vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
      ::emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                  *)&MemberStack,(ShaderParameterInfo **)&msg);
      msg._M_dataplus._M_p =
           (pointer)(pSVar15->members).
                    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
      ::
      emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                  *)&MemberItStack,
                 (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                  *)&msg);
      if (((pSVar15->storageQualifier != Ret) && ((pSVar15->GSAttribs).PrimType == Undefined)) &&
         ((pSVar15->HSAttribs).PatchType == Undefined)) {
        poVar7 = std::operator<<(local_4b8,"    ");
        poVar7 = std::operator<<(poVar7,(pSVar15->Type)._M_dataplus._M_p);
        poVar7 = std::operator<<(poVar7,' ');
        std::operator<<(poVar7,(pSVar15->Name)._M_dataplus._M_p);
        if ((pSVar15->ArraySize)._M_string_length != 0) {
          poVar7 = std::operator<<(local_4b8,'[');
          poVar7 = std::operator<<(poVar7,(string *)&pSVar15->ArraySize);
          std::operator<<(poVar7,']');
        }
        std::operator<<(local_4b8,";\n");
      }
      while (MemberStack.
             super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             MemberStack.
             super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        pSVar2 = MemberStack.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1];
        Args_1 = (pSVar2->members).
                 super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar8 = (pSVar2->members).
                 super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (Args_1 == pSVar8) {
          if (MemberItStack.
              super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current != Args_1) {
            FormatString<char[26],char[49]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                       (char (*) [49])Args_1);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb19);
            std::__cxx11::string::~string((string *)&msg);
          }
          if ((pSVar2->Semantic)._M_string_length == 0) {
            LogError<true,char[36],std::__cxx11::string,char[2]>
                      (false,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar2->Name,
                       (char (*) [2])0x2dfbac);
          }
          GLSLVariable._M_dataplus._M_p = (pointer)&GLSLVariable.field_2;
          GLSLVariable._M_string_length = 0;
          Args_3 = &pSVar2->Semantic;
          GLSLVariable.field_2._M_local_buf[0] = '\0';
          pHVar3 = this->m_Converter;
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)&msg,(Args_3->_M_dataplus)._M_p,false);
          pCVar17 = (ConversionStream *)&msg;
          cVar9 = std::
                  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)&pHVar3->m_HLSLSemanticToGLSLVar,(key_type *)&msg);
          HashMapStringKey::Clear((HashMapStringKey *)&msg);
          if (cVar9.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            pCVar17 = (ConversionStream *)
                      ((long)cVar9.
                             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                             ._M_cur + 0x18);
            std::__cxx11::string::_M_assign((string *)&GLSLVariable);
          }
          BuildParameterName_abi_cxx11_((String *)&msg,pCVar17,&MemberStack,'.',"","","");
          if (GLSLVariable._M_string_length == 0) {
            InputLocation = local_5dc;
            SemanticEndPos._M_current = (pSVar2->Semantic)._M_dataplus._M_p;
            EndPtr = SemanticEndPos._M_current + (pSVar2->Semantic)._M_string_length;
            bVar6 = Parsing::
                    SkipString<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              (&SemanticEndPos,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&EndPtr,"attrib",&SemanticEndPos);
            if (bVar6) {
              EndPtr = (char *)0x0;
              lVar10 = strtol(SemanticEndPos._M_current,&EndPtr,10);
              if ((EndPtr != (char *)0x0) && (*EndPtr == '\0')) {
                InputLocation = (int)lVar10;
                local_5dc = InputLocation;
              }
            }
            iVar11 = std::
                     _Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&LocationToSemantic._M_h,&InputLocation);
            if (iVar11.super__Node_iterator_base<std::pair<const_int,_const_char_*>,_false>._M_cur
                != (__node_type *)0x0) {
              LogError<true,char[10],int,char[24],std::__cxx11::string,char[37],char_const*,char[69]>
                        (false,"operator()",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xbe7,(char (*) [10])"Location ",&InputLocation,
                         (char (*) [24])" assigned to semantic \"",Args_3,
                         (char (*) [37])"\" conflicts with previous semantic \"",
                         (char **)((long)iVar11.
                                         super__Node_iterator_base<std::pair<const_int,_const_char_*>,_false>
                                         ._M_cur + 0x10),
                         (char (*) [69])
                         "\". Please use ATTRIB* semantic to explicitly specify attribute index");
            }
            pcVar4 = (Args_3->_M_dataplus)._M_p;
            pCVar17 = (ConversionStream *)&InputLocation;
            ppcVar12 = std::__detail::
                       _Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&LocationToSemantic,(key_type *)pCVar17);
            *ppcVar12 = pcVar4;
            BuildParameterName_abi_cxx11_((String *)&EndPtr,pCVar17,&MemberStack,'_',"_vsin_","","")
            ;
            DefineInterfaceVar(InputLocation,(char *)0x0,"in",&pSVar2->Type,(String *)&EndPtr,
                               &GlobalVarsSS);
            InitVariable((String *)&msg,(String *)&EndPtr,&PrologueSS);
            local_5dc = local_5dc + 1;
            std::__cxx11::string::~string((string *)&EndPtr);
          }
          else {
            poVar7 = std::operator<<(local_4b8,"    ");
            poVar7 = std::operator<<(poVar7,(string *)&GLSLVariable);
            poVar7 = std::operator<<(poVar7,'(');
            poVar7 = std::operator<<(poVar7,(string *)&msg);
            std::operator<<(poVar7,");\n");
          }
          std::__cxx11::string::~string((string *)&msg);
          MemberStack.
          super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               MemberStack.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          MemberItStack.
          super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               MemberItStack.
               super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          std::__cxx11::string::~string((string *)&GLSLVariable);
        }
        else {
          if ((pSVar2->Semantic)._M_string_length != 0) {
            LogError<true,char[35],std::__cxx11::string,char[2]>
                      (false,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar2->Name,
                       (char (*) [2])0x2dfbac);
            pSVar8 = (pSVar2->members).
                     super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          pSVar2 = MemberItStack.
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current;
          if (pSVar2 == pSVar8) {
            MemberStack.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 MemberStack.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            MemberItStack.
            super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 MemberItStack.
                 super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
          }
          else {
            MemberItStack.
            super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current = pSVar2 + 1;
            msg._M_dataplus._M_p = (pointer)pSVar2;
            std::
            vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
            ::
            emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                      ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                        *)&MemberStack,(ShaderParameterInfo **)&msg);
            msg._M_dataplus._M_p =
                 (pointer)(pSVar2->members).
                          super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            std::
            vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
            ::
            emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                      ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                        *)&MemberItStack,
                       (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                        *)&msg);
          }
        }
      }
      goto LAB_001c8d9c;
    }
    pSVar15 = pSVar15 + 1;
  } while( true );
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessVertexShaderArguments(std::vector<ShaderParameterInfo>& Params,
                                                                            String&                           GlobalVariables,
                                                                            std::stringstream&                ReturnHandlerSS,
                                                                            String&                           Prologue)
{
    stringstream GlobalVarsSS, PrologueSS, InterfaceVarsSS;
    int          OutLocation       = 0;
    int          AutoInputLocation = 0; // Automatically assigned input location

    std::unordered_map<int, const Char*> LocationToSemantic;
    for (const auto& Param : Params)
    {
        if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            ProcessShaderArgument(
                Param, VSInd, InVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                {
                    String FullParamName = BuildParameterName(MemberStack, '.');
                    if (!Getter.empty())
                        PrologueSS << "    " << Getter << '(' << FullParamName << ");\n";
                    else
                    {
                        int         InputLocation  = AutoInputLocation;
                        const auto& Semantic       = Param.Semantic;
                        auto        SemanticEndPos = Semantic.begin();
                        if (Parsing::SkipString(SemanticEndPos, Semantic.end(), "attrib", SemanticEndPos))
                        {
                            char* EndPtr    = nullptr;
                            auto  AttribInd = static_cast<int>(strtol(&*SemanticEndPos, &EndPtr, 10));
                            if (EndPtr != nullptr && *EndPtr == 0)
                            {
                                InputLocation     = AttribInd;
                                AutoInputLocation = InputLocation;
                            }
                        }
                        auto it = LocationToSemantic.find(InputLocation);
                        if (it != LocationToSemantic.end())
                        {
                            LOG_ERROR_AND_THROW("Location ", InputLocation, " assigned to semantic \"", Semantic, "\" conflicts with previous semantic \"", it->second, "\". Please use ATTRIB* semantic to explicitly specify attribute index");
                        }
                        LocationToSemantic[InputLocation] = Semantic.c_str();
                        auto InputVarName                 = BuildParameterName(MemberStack, '_', "_vsin_");
                        // Interpolation qualifiers are not allowed on VS inputs.
                        const char* Interpolation = nullptr;
                        // Layout location qualifiers are allowed on VS inputs even in GLES3.0.
                        DefineInterfaceVar(InputLocation, Interpolation, "in", Param.Type, InputVarName, GlobalVarsSS);
                        InitVariable(FullParamName, InputVarName, PrologueSS);
                        AutoInputLocation++;
                    }
                } //
            );
        }
        else if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Out ||
                 Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret)
        {
            ProcessShaderArgument(
                Param, VSInd, OutVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Setter) //
                {
                    String FullParamName = BuildParameterName(MemberStack, '.', "", Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret ? "_RET_VAL_" : "");
                    if (!Setter.empty())
                        ReturnHandlerSS << Setter << '(' << FullParamName << ");\\\n";
                    else
                    {
                        auto OutputVarName = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_vsout_" : "_");
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? OutLocation++ : -1,
                                           GetInterpolationQualifier(Param), "out",
                                           Param.Type, OutputVarName, InterfaceVarsSS);
                        ReturnHandlerSS << OutputVarName << " = " << FullParamName << ";\\\n";
                    }
                } //
            );
        }
    }

    GlobalVarsSS << InterfaceVarsSS.str();
    GlobalVariables = GlobalVarsSS.str();
    Prologue        = PrologueSS.str();
}